

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int check_bounds(FullMvLimits *mv_limits,int row,int col,int range)

{
  return (int)((range + col <= mv_limits->col_max && range + row <= mv_limits->row_max) &&
              (mv_limits->col_min <= col - range && mv_limits->row_min <= row - range));
}

Assistant:

static inline int check_bounds(const FullMvLimits *mv_limits, int row, int col,
                               int range) {
  return ((row - range) >= mv_limits->row_min) &
         ((row + range) <= mv_limits->row_max) &
         ((col - range) >= mv_limits->col_min) &
         ((col + range) <= mv_limits->col_max);
}